

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *this,uint args,uchar args_1,unsigned_short args_2,unsigned_short args_3,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<ot::commissioner::Error> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  local_48;
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  holder;
  ArgumentTuple tuple;
  unsigned_short local_20;
  uchar local_1d;
  uint uStack_1c;
  unsigned_short args_local_3;
  unsigned_short args_local_2;
  uchar args_local_1;
  uint args_local;
  FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  tuple.
  super__Tuple_impl<0UL,_unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._22_2_ = args_3;
  local_20 = args_2;
  local_1d = args_1;
  uStack_1c = args;
  _args_local_2 = this;
  this_local = (FunctionMocker<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)__return_storage_ptr__;
  std::
  tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::
  tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
            ((tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&holder,&stack0xffffffffffffffe4,&local_1d,&local_20,
             (unsigned_short *)
             &tuple.
              super__Tuple_impl<0UL,_unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              .field_0x16,args_4);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<ot::commissioner::Error>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>>>
              *)&local_48,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
            ::operator->(&local_48);
  ActionResultHolder<ot::commissioner::Error>::Unwrap(__return_storage_ptr__,this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<ot::commissioner::Error>,_std::default_delete<testing::internal::ActionResultHolder<ot::commissioner::Error>_>_>
  ::~unique_ptr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }